

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.h
# Opt level: O2

void __thiscall BlockFilter::Unserialize<DataStream>(BlockFilter *this,DataStream *s)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_filter_00;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  BlockFilterType BVar5;
  bool bVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  GCSFilter local_98;
  Params local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_filter;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BVar5 = ser_readdata8<DataStream>(s);
  base_blob<256U>::Unserialize<DataStream>(&(this->m_block_hash).super_base_blob<256U>,s);
  Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,&encoded_filter);
  this->m_filter_type = BVar5;
  local_58.m_siphash_k0 = 0;
  local_58.m_siphash_k1 = 0;
  local_58.m_P = '\0';
  local_58.m_M = 1;
  bVar6 = BuildParams(this,&local_58);
  puVar4 = encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar3 = encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar6) {
    encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    encoded_filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
    encoded_filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar2;
    encoded_filter_00.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar4;
    GCSFilter::GCSFilter(&local_98,&local_58,encoded_filter_00,SUB81(&stack0xffffffffffffff48,0));
    GCSFilter::operator=(&this->m_filter,&local_98);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_98.m_encoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              );
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &stack0xffffffffffffff48);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&encoded_filter.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    pcVar7 = (char *)__cxa_allocate_exception(0x20);
    local_98.m_params.m_siphash_k1 = std::iostream_category();
    local_98.m_params.m_siphash_k0._0_4_ = 1;
    std::ios_base::failure[abi:cxx11]::failure(pcVar7,(error_code *)"unknown filter_type");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar7,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s) {
        std::vector<unsigned char> encoded_filter;
        uint8_t filter_type;

        s >> filter_type
          >> m_block_hash
          >> encoded_filter;

        m_filter_type = static_cast<BlockFilterType>(filter_type);

        GCSFilter::Params params;
        if (!BuildParams(params)) {
            throw std::ios_base::failure("unknown filter_type");
        }
        m_filter = GCSFilter(params, std::move(encoded_filter), /*skip_decode_check=*/false);
    }